

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O3

int __thiscall
JsUtil::
Cache<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
::CacheStore::Add(CacheStore *this,EvalMapStringInternal<false> *key,FunctionInfo **value)

{
  int iVar1;
  undefined1 local_28 [8];
  AutoRestoreValue<bool> var;
  
  var._0_8_ = &this->inAdd;
  var.variable._0_1_ = this->inAdd;
  this->inAdd = true;
  local_28[0] = true;
  iVar1 = BaseDictionary<Js::EvalMapStringInternal<false>,Js::FunctionInfo*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::FunctionInfo*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    ((BaseDictionary<Js::EvalMapStringInternal<false>,Js::FunctionInfo*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this,key,value);
  Memory::AutoRestoreValue<bool>::~AutoRestoreValue((AutoRestoreValue<bool> *)local_28);
  return iVar1;
}

Assistant:

int Add(const TKey& key, const TValue& value)
            {
                AutoRestoreValue<bool> var(&this->inAdd, true);

                return __super::Add(key, value);
            }